

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void iCopyColors<cI16,cBGRA,bAdd>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  FSpecialColormap *pFVar4;
  long lVar5;
  BYTE BVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  byte *pbVar10;
  long lVar11;
  int iVar12;
  
  pFVar4 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_0064010a_caseD_0:
    if (0 < count) {
      pbVar10 = pin + 1;
      lVar5 = 0;
      do {
        iVar9 = (int)((uint)*pbVar10 * inf->alpha + (uint)pout[lVar5 * 4 + 2] * 0x10000) >> 0x10;
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        pout[lVar5 * 4 + 2] = (BYTE)iVar9;
        iVar9 = (int)((uint)*pbVar10 * inf->alpha + (uint)pout[lVar5 * 4 + 1] * 0x10000) >> 0x10;
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        pout[lVar5 * 4 + 1] = (BYTE)iVar9;
        iVar9 = (int)((uint)*pbVar10 * inf->alpha + (uint)pout[lVar5 * 4] * 0x10000) >> 0x10;
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        pout[lVar5 * 4] = (BYTE)iVar9;
        pout[lVar5 * 4 + 3] = 0xff;
        lVar5 = lVar5 + 1;
        pbVar10 = pbVar10 + step;
      } while (count != (int)lVar5);
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_0064010a_caseD_0;
    case BLEND_ICEMAP:
      if (0 < count) {
        pbVar10 = pin + 1;
        lVar5 = 0;
        do {
          bVar1 = *pbVar10 >> 4;
          iVar9 = (int)((uint)IcePalette[bVar1][0] * inf->alpha +
                       (uint)pout[lVar5 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          pout[lVar5 * 4 + 2] = (BYTE)iVar9;
          iVar9 = (int)((uint)IcePalette[bVar1][1] * inf->alpha +
                       (uint)pout[lVar5 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          pout[lVar5 * 4 + 1] = (BYTE)iVar9;
          iVar9 = (int)((uint)IcePalette[bVar1][2] * inf->alpha + (uint)pout[lVar5 * 4] * 0x10000)
                  >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          pout[lVar5 * 4] = (BYTE)iVar9;
          pout[lVar5 * 4 + 3] = 0xff;
          lVar5 = lVar5 + 1;
          pbVar10 = pbVar10 + step;
        } while (count != (int)lVar5);
      }
      break;
    case BLEND_OVERLAY:
      if (0 < count) {
        pbVar10 = pin + 1;
        lVar5 = 0;
        do {
          iVar12 = (uint)*pbVar10 * inf->blendcolor[3];
          iVar9 = inf->blendcolor[1];
          iVar3 = inf->blendcolor[2];
          iVar7 = ((uint)(inf->blendcolor[0] + iVar12) >> 0x10 & 0xff) * inf->alpha +
                  (uint)pout[lVar5 * 4 + 2] * 0x10000;
          BVar6 = (BYTE)((uint)iVar7 >> 0x10);
          if (0xfe < iVar7 >> 0x10) {
            BVar6 = 0xff;
          }
          pout[lVar5 * 4 + 2] = BVar6;
          iVar9 = ((uint)(iVar9 + iVar12) >> 0x10 & 0xff) * inf->alpha +
                  (uint)pout[lVar5 * 4 + 1] * 0x10000;
          BVar6 = (BYTE)((uint)iVar9 >> 0x10);
          if (0xfe < iVar9 >> 0x10) {
            BVar6 = 0xff;
          }
          pout[lVar5 * 4 + 1] = BVar6;
          iVar9 = ((uint)(iVar12 + iVar3) >> 0x10 & 0xff) * inf->alpha +
                  (uint)pout[lVar5 * 4] * 0x10000;
          BVar6 = (BYTE)((uint)iVar9 >> 0x10);
          if (0xfe < iVar9 >> 0x10) {
            BVar6 = 0xff;
          }
          pout[lVar5 * 4] = BVar6;
          pout[lVar5 * 4 + 3] = 0xff;
          lVar5 = lVar5 + 1;
          pbVar10 = pbVar10 + step;
        } while (count != (int)lVar5);
      }
      break;
    case BLEND_MODULATE:
      if (0 < count) {
        pbVar10 = pin + 1;
        lVar5 = 0;
        do {
          bVar1 = *pbVar10;
          iVar9 = (int)((inf->blendcolor[0] * (uint)bVar1 >> 0x10 & 0xff) * inf->alpha +
                       (uint)pout[lVar5 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          iVar3 = inf->blendcolor[1];
          iVar7 = inf->blendcolor[2];
          pout[lVar5 * 4 + 2] = (BYTE)iVar9;
          iVar9 = (int)((iVar3 * (uint)bVar1 >> 0x10 & 0xff) * inf->alpha +
                       (uint)pout[lVar5 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          pout[lVar5 * 4 + 1] = (BYTE)iVar9;
          iVar9 = (int)(((uint)bVar1 * iVar7 >> 0x10 & 0xff) * inf->alpha +
                       (uint)pout[lVar5 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          pout[lVar5 * 4] = (BYTE)iVar9;
          pout[lVar5 * 4 + 3] = 0xff;
          lVar5 = lVar5 + 1;
          pbVar10 = pbVar10 + step;
        } while (count != (int)lVar5);
      }
      break;
    default:
      lVar5 = (long)inf->blend;
      if (lVar5 < 0x21) {
        if (0 < count && BLEND_ICEMAP < inf->blend) {
          pbVar10 = pin + 1;
          lVar5 = 0;
          do {
            bVar1 = *pbVar10;
            iVar9 = (int)(inf->alpha * (uint)bVar1 + (uint)pout[lVar5 * 4 + 2] * 0x10000) >> 0x10;
            if (0xfe < iVar9) {
              iVar9 = 0xff;
            }
            pout[lVar5 * 4 + 2] = (BYTE)iVar9;
            iVar9 = (int)(inf->alpha * (uint)bVar1 + (uint)pout[lVar5 * 4 + 1] * 0x10000) >> 0x10;
            if (0xfe < iVar9) {
              iVar9 = 0xff;
            }
            pout[lVar5 * 4 + 1] = (BYTE)iVar9;
            iVar9 = (int)((uint)bVar1 * inf->alpha + (uint)pout[lVar5 * 4] * 0x10000) >> 0x10;
            if (0xfe < iVar9) {
              iVar9 = 0xff;
            }
            pout[lVar5 * 4] = (BYTE)iVar9;
            pout[lVar5 * 4 + 3] = 0xff;
            lVar5 = lVar5 + 1;
            pbVar10 = pbVar10 + step;
          } while (count != (int)lVar5);
        }
      }
      else if (0 < count) {
        pbVar10 = pin + 1;
        lVar11 = 0;
        do {
          uVar8 = (ulong)*pbVar10;
          iVar9 = (int)((uint)*(byte *)((long)pFVar4 + uVar8 * 4 + lVar5 * 0x518 + -0xa6fe) *
                        inf->alpha + (uint)pout[lVar11 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          bVar1 = *(byte *)((long)pFVar4 + uVar8 * 4 + lVar5 * 0x518 + -0xa700);
          bVar2 = *(byte *)((long)pFVar4 + uVar8 * 4 + lVar5 * 0x518 + -0xa6ff);
          pout[lVar11 * 4 + 2] = (BYTE)iVar9;
          iVar9 = (int)((uint)bVar2 * inf->alpha + (uint)pout[lVar11 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          pout[lVar11 * 4 + 1] = (BYTE)iVar9;
          iVar9 = (int)((uint)bVar1 * inf->alpha + (uint)pout[lVar11 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          pout[lVar11 * 4] = (BYTE)iVar9;
          pout[lVar11 * 4 + 3] = 0xff;
          lVar11 = lVar11 + 1;
          pbVar10 = pbVar10 + step;
        } while (count != (int)lVar11);
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}